

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

bool duckdb::Value::ValuesAreEqual
               (CastFunctionSet *set,GetCastFunctionInput *get_input,Value *result_value,
               Value *value)

{
  LogicalTypeId LVar1;
  bool bVar2;
  byte bVar3;
  string *psVar4;
  Value *value_00;
  string local_f0;
  Value local_d0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar3 = result_value->is_null;
  while( true ) {
    value_00 = value;
    value = result_value;
    if (((bVar3 & 1) != 0) || (value_00->is_null != false)) {
      bVar3 = bVar3 ^ value_00->is_null ^ 1;
      goto LAB_012b645e;
    }
    LVar1 = (value_00->type_).id_;
    if (LVar1 == VARCHAR) break;
    if (LVar1 == DOUBLE) {
      LogicalType::LogicalType((LogicalType *)&local_f0,DOUBLE);
      CastAs(&local_d0,value,set,get_input,(LogicalType *)&local_f0,false);
      LogicalType::~LogicalType((LogicalType *)&local_f0);
      bVar3 = ApproxEqual((value_00->value_).double_,
                          (double)CONCAT44(local_d0.value_.interval.days,local_d0.value_.integer));
      goto LAB_012b6454;
    }
    if (LVar1 == FLOAT) {
      LogicalType::LogicalType((LogicalType *)&local_f0,FLOAT);
      CastAs(&local_d0,value,set,get_input,(LogicalType *)&local_f0,false);
      LogicalType::~LogicalType((LogicalType *)&local_f0);
      bVar3 = ApproxEqual((value_00->value_).float_,local_d0.value_.float_);
      goto LAB_012b6454;
    }
    bVar3 = 0;
    result_value = value_00;
    if (((value->type_).id_ & ~SQLNULL) != FLOAT) {
      bVar2 = ValueOperations::Equals(value_00,value);
      return bVar2;
    }
  }
  LogicalType::LogicalType((LogicalType *)&local_f0,VARCHAR);
  CastAs(&local_d0,value,set,get_input,(LogicalType *)&local_f0,false);
  LogicalType::~LogicalType((LogicalType *)&local_f0);
  psVar4 = StringValue::Get_abi_cxx11_(&local_d0);
  ::std::__cxx11::string::string((string *)&local_70,(string *)psVar4);
  SanitizeValue(&local_f0,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  psVar4 = StringValue::Get_abi_cxx11_(value_00);
  ::std::__cxx11::string::string((string *)&local_90,(string *)psVar4);
  SanitizeValue(&local_50,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  bVar3 = ::std::operator==(&local_f0,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_f0);
LAB_012b6454:
  ~Value(&local_d0);
LAB_012b645e:
  return (bool)(bVar3 & 1);
}

Assistant:

bool Value::ValuesAreEqual(CastFunctionSet &set, GetCastFunctionInput &get_input, const Value &result_value,
                           const Value &value) {
	if (result_value.IsNull() != value.IsNull()) {
		return false;
	}
	if (result_value.IsNull() && value.IsNull()) {
		// NULL = NULL in checking code
		return true;
	}
	switch (value.type_.id()) {
	case LogicalTypeId::FLOAT: {
		auto other = result_value.CastAs(set, get_input, LogicalType::FLOAT);
		float ldecimal = value.value_.float_;
		float rdecimal = other.value_.float_;
		return ApproxEqual(ldecimal, rdecimal);
	}
	case LogicalTypeId::DOUBLE: {
		auto other = result_value.CastAs(set, get_input, LogicalType::DOUBLE);
		double ldecimal = value.value_.double_;
		double rdecimal = other.value_.double_;
		return ApproxEqual(ldecimal, rdecimal);
	}
	case LogicalTypeId::VARCHAR: {
		auto other = result_value.CastAs(set, get_input, LogicalType::VARCHAR);
		string left = SanitizeValue(StringValue::Get(other));
		string right = SanitizeValue(StringValue::Get(value));
		return left == right;
	}
	default:
		if (result_value.type_.id() == LogicalTypeId::FLOAT || result_value.type_.id() == LogicalTypeId::DOUBLE) {
			return Value::ValuesAreEqual(set, get_input, value, result_value);
		}
		return value == result_value;
	}
}